

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_file_type(char *name,int *typep)

{
  int iVar1;
  int *piVar2;
  undefined1 local_b0 [8];
  stat sbuf;
  int *typep_local;
  char *name_local;
  
  sbuf.__glibc_reserved[2] = (__syscall_slong_t)typep;
  iVar1 = stat(name,(stat *)local_b0);
  if (iVar1 == 0) {
    if (((uint)sbuf.st_nlink & 0xf000) == 0x4000) {
      *(undefined4 *)sbuf.__glibc_reserved[2] = 1;
    }
    else if (((uint)sbuf.st_nlink & 0xf000) == 0x8000) {
      *(undefined4 *)sbuf.__glibc_reserved[2] = 0;
    }
    else {
      *(undefined4 *)sbuf.__glibc_reserved[2] = 2;
    }
    name_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    name_local._4_4_ = nni_plat_errno(*piVar2);
  }
  return name_local._4_4_;
}

Assistant:

int
nni_plat_file_type(const char *name, int *typep)
{
	struct stat sbuf;

	if (stat(name, &sbuf) != 0) {
		return (nni_plat_errno(errno));
	}
	switch (sbuf.st_mode & S_IFMT) {
	case S_IFREG:
		*typep = NNI_PLAT_FILE_TYPE_FILE;
		break;
	case S_IFDIR:
		*typep = NNI_PLAT_FILE_TYPE_DIR;
		break;
	default:
		*typep = NNI_PLAT_FILE_TYPE_OTHER;
		break;
	}
	return (0);
}